

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

void free_sh(JSRuntime *rt,JSOSSignalHandler *sh)

{
  int *piVar1;
  int iVar2;
  list_head *plVar3;
  list_head *plVar4;
  JSValue v;
  
  plVar3 = (sh->link).prev;
  plVar4 = (sh->link).next;
  plVar3->next = plVar4;
  plVar4->prev = plVar3;
  (sh->link).prev = (list_head *)0x0;
  (sh->link).next = (list_head *)0x0;
  piVar1 = (int *)(sh->func).u.ptr;
  v = sh->func;
  if ((0xfffffff4 < (uint)(sh->func).tag) && (iVar2 = *piVar1, *piVar1 = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(rt,v);
  }
  js_free_rt(rt,sh);
  return;
}

Assistant:

static void free_sh(JSRuntime *rt, JSOSSignalHandler *sh)
{
    list_del(&sh->link);
    JS_FreeValueRT(rt, sh->func);
    js_free_rt(rt, sh);
}